

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMS_ALG_PROPERTY_Array_Marshal
                 (TPMS_ALG_PROPERTY *source,BYTE **buffer,INT32 *size,INT32 count)

{
  UINT16 UVar1;
  int local_2c;
  UINT16 local_26;
  INT32 i;
  UINT16 result;
  INT32 count_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_ALG_PROPERTY *source_local;
  
  local_26 = 0;
  for (local_2c = 0; local_2c < count; local_2c = local_2c + 1) {
    UVar1 = TPMS_ALG_PROPERTY_Marshal(source + local_2c,buffer,size);
    local_26 = local_26 + UVar1;
  }
  return local_26;
}

Assistant:

UINT16
TPMS_ALG_PROPERTY_Array_Marshal(TPMS_ALG_PROPERTY *source, BYTE **buffer, INT32 *size, INT32 count)
{
    UINT16    result = 0;
    INT32 i;
    for(i = 0; i < count; i++) {
        result = (UINT16)(result + TPMS_ALG_PROPERTY_Marshal(&source[i], buffer, size));
    }
    return result;
}